

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O3

Vec4 __thiscall
deqp::gles3::Functional::anon_unknown_1::genRandomVector(anon_unknown_1 *this,Random *rnd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec4 VVar4;
  
  fVar1 = deRandom_getFloat(&rnd->m_rnd);
  fVar2 = deRandom_getFloat(&rnd->m_rnd);
  fVar3 = deRandom_getFloat(&rnd->m_rnd);
  VVar4.m_data[0] = deRandom_getFloat(&rnd->m_rnd);
  VVar4.m_data[2] = fVar1 * 2.0 + -1.0;
  VVar4.m_data[3] = fVar2 * 2.0 + -1.0;
  *(float *)this = VVar4.m_data[2];
  *(float *)(this + 4) = VVar4.m_data[3];
  *(float *)(this + 8) = fVar3 * 2.0 + -1.0;
  *(float *)(this + 0xc) = VVar4.m_data[0] * 0.8 + 0.2;
  VVar4.m_data[1] = (float)extraout_XMM0_Db;
  return (Vec4)VVar4.m_data;
}

Assistant:

static tcu::Vec4 genRandomVector (de::Random& rnd)
{
	tcu::Vec4 retVal;

	retVal.x() = rnd.getFloat(-1.0f, 1.0f);
	retVal.y() = rnd.getFloat(-1.0f, 1.0f);
	retVal.z() = rnd.getFloat(-1.0f, 1.0f);
	retVal.w() = rnd.getFloat( 0.2f, 1.0f);

	return retVal;
}